

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_259da0::AlsaPlayback::mixerProc(AlsaPlayback *this)

{
  ALCdevice *pAVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  char *__format;
  long lVar10;
  snd_pcm_uframes_t frames;
  snd_pcm_uframes_t offset;
  snd_pcm_channel_area_t *areas;
  long local_68;
  FILE *local_60;
  pthread_mutex_t *local_58;
  long local_50;
  ulong local_48;
  long *local_40;
  ulong local_38;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  uVar3 = BytesFromDevFmt(((this->super_BackendBase).mDevice)->FmtType);
  pAVar1 = (this->super_BackendBase).mDevice;
  local_48 = (ulong)pAVar1->UpdateSize;
  local_38 = (ulong)pAVar1->BufferSize;
  local_58 = (pthread_mutex_t *)&this->mMutex;
  do {
    if (((this->mKillNow)._M_base._M_i & 1U) != 0) {
      return 0;
    }
    iVar4 = verify_state(this->mPcmHandle);
    if (iVar4 < 0) {
      if (0 < (int)gLogLevel) {
        _GLOBAL__N_1::AlsaPlayback::mixerProc();
      }
      pAVar1 = (this->super_BackendBase).mDevice;
      uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar4);
      ALCdevice::handleDisconnect(pAVar1,"Bad state: %s",uVar9);
    }
    else {
      uVar7 = (*(anonymous_namespace)::psnd_pcm_avail_update)(this->mPcmHandle);
      if ((long)uVar7 < 0) {
        if (0 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
      }
      else if (local_38 < uVar7) {
        if (1 < (int)gLogLevel) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
        (*(anonymous_namespace)::psnd_pcm_reset)(this->mPcmHandle);
      }
      else if (uVar7 < local_48) {
        if (iVar4 != 3) {
          iVar5 = (*(anonymous_namespace)::psnd_pcm_start)(this->mPcmHandle);
          if ((iVar5 < 0) && (0 < (int)gLogLevel)) {
            _GLOBAL__N_1::AlsaPlayback::mixerProc();
          }
          if (iVar5 < 0) goto LAB_0016369c;
        }
        iVar5 = (*(anonymous_namespace)::psnd_pcm_wait)(this->mPcmHandle,1000);
        if ((iVar5 == 0) && (0 < (int)gLogLevel)) {
          _GLOBAL__N_1::AlsaPlayback::mixerProc();
        }
      }
      else {
        iVar5 = pthread_mutex_lock(local_58);
        if (iVar5 != 0) {
          std::__throw_system_error(iVar5);
        }
        lVar10 = uVar7 - uVar7 % local_48;
        do {
          if (lVar10 == 0) break;
          local_40 = (long *)0x0;
          local_50 = 0;
          local_68 = lVar10;
          iVar5 = (*(anonymous_namespace)::psnd_pcm_mmap_begin)
                            (this->mPcmHandle,&local_40,&local_50,&local_68);
          if (iVar5 < 0) {
            if (0 < (int)gLogLevel) {
              local_60 = (FILE *)gLogFile;
              uVar9 = (*(anonymous_namespace)::psnd_strerror)(iVar5);
              __format = "[ALSOFT] (EE) mmap begin error: %s\n";
              goto LAB_00163686;
            }
LAB_00163652:
            bVar2 = false;
          }
          else {
            ALCdevice::renderSamples
                      ((this->super_BackendBase).mDevice,
                       (void *)(((ulong)*(uint *)((long)local_40 + 0xc) * local_50 >> 3) + *local_40
                               ),(ALuint)local_68,
                       (ulong)*(uint *)((long)local_40 + 0xc) / (ulong)(uVar3 << 3));
            lVar8 = (*(anonymous_namespace)::psnd_pcm_mmap_commit)
                              (this->mPcmHandle,local_50,local_68);
            if ((lVar8 < 0) || (lVar8 != local_68)) {
              if ((int)gLogLevel < 1) goto LAB_00163652;
              local_60 = (FILE *)gLogFile;
              uVar6 = (undefined4)lVar8;
              if (-1 < lVar8) {
                uVar6 = 0xffffffe0;
              }
              uVar9 = (*(anonymous_namespace)::psnd_strerror)(uVar6);
              __format = "[ALSOFT] (EE) mmap commit error: %s\n";
LAB_00163686:
              bVar2 = false;
              fprintf(local_60,__format,uVar9);
            }
            else {
              lVar10 = lVar10 - local_68;
              bVar2 = true;
            }
          }
        } while (bVar2);
        pthread_mutex_unlock(local_58);
      }
    }
LAB_0016369c:
    if (iVar4 < 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int AlsaPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t samplebits{mDevice->bytesFromFmt() * 8};
    const snd_pcm_uframes_t update_size{mDevice->UpdateSize};
    const snd_pcm_uframes_t buffer_size{mDevice->BufferSize};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        int state{verify_state(mPcmHandle)};
        if(state < 0)
        {
            ERR("Invalid state detected: %s\n", snd_strerror(state));
            mDevice->handleDisconnect("Bad state: %s", snd_strerror(state));
            break;
        }

        snd_pcm_sframes_t avails{snd_pcm_avail_update(mPcmHandle)};
        if(avails < 0)
        {
            ERR("available update failed: %s\n", snd_strerror(static_cast<int>(avails)));
            continue;
        }
        snd_pcm_uframes_t avail{static_cast<snd_pcm_uframes_t>(avails)};

        if(avail > buffer_size)
        {
            WARN("available samples exceeds the buffer size\n");
            snd_pcm_reset(mPcmHandle);
            continue;
        }

        // make sure there's frames to process
        if(avail < update_size)
        {
            if(state != SND_PCM_STATE_RUNNING)
            {
                int err{snd_pcm_start(mPcmHandle)};
                if(err < 0)
                {
                    ERR("start failed: %s\n", snd_strerror(err));
                    continue;
                }
            }
            if(snd_pcm_wait(mPcmHandle, 1000) == 0)
                ERR("Wait timeout... buffer size too low?\n");
            continue;
        }
        avail -= avail%update_size;

        // it is possible that contiguous areas are smaller, thus we use a loop
        std::lock_guard<std::mutex> _{mMutex};
        while(avail > 0)
        {
            snd_pcm_uframes_t frames{avail};

            const snd_pcm_channel_area_t *areas{};
            snd_pcm_uframes_t offset{};
            int err{snd_pcm_mmap_begin(mPcmHandle, &areas, &offset, &frames)};
            if(err < 0)
            {
                ERR("mmap begin error: %s\n", snd_strerror(err));
                break;
            }

            char *WritePtr{static_cast<char*>(areas->addr) + (offset * areas->step / 8)};
            mDevice->renderSamples(WritePtr, static_cast<ALuint>(frames), areas->step/samplebits);

            snd_pcm_sframes_t commitres{snd_pcm_mmap_commit(mPcmHandle, offset, frames)};
            if(commitres < 0 || static_cast<snd_pcm_uframes_t>(commitres) != frames)
            {
                ERR("mmap commit error: %s\n",
                    snd_strerror(commitres >= 0 ? -EPIPE : static_cast<int>(commitres)));
                break;
            }

            avail -= frames;
        }
    }

    return 0;
}